

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_tests.cpp
# Opt level: O2

void __thiscall validation_tests::signet_parse_tests::test_method(signet_parse_tests *this)

{
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this_00;
  long lVar1;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> uVar2;
  bool bVar3;
  CScript *pCVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar5;
  reference pvVar6;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  int iVar10;
  long in_FS_OFFSET;
  const_string file;
  initializer_list<unsigned_char> __l;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  initializer_list<unsigned_char> __l_00;
  const_string file_04;
  const_string file_05;
  initializer_list<unsigned_char> __l_01;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  check_type cVar11;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  assertion_result local_630;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_commitment_section_325;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  assertion_result local_540;
  allocator_type *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  CMutableTransaction cb;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> signet_params;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_commitment_section_141;
  undefined1 local_418 [16];
  undefined1 *local_408 [30];
  bool local_318;
  CScript challenge;
  CBlock block;
  ArgsManager signet_argsman;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&signet_argsman);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_418,"-signetchallenge",(allocator<char> *)&cb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&block,"51",(allocator<char> *)&challenge);
  ArgsManager::ForceSetArg(&signet_argsman,(string *)local_418,(string *)&block);
  std::__cxx11::string::~string((string *)&block);
  std::__cxx11::string::~string((string *)local_418);
  CreateChainParams((ArgsManager *)&signet_params,(ChainType)&signet_argsman);
  CBlock::CBlock(&block);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4b;
  file.m_begin = (iterator)&local_448;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_458,msg);
  uVar2 = signet_params;
  witness_commitment_section_141.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(witness_commitment_section_141.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,0x51);
  __l._M_len = 1;
  __l._M_array = (iterator)&witness_commitment_section_141;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&challenge,__l,
             (allocator_type *)&witness_commitment_section_325);
  bVar3 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          ((long)uVar2._M_t.
                                 super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                                 .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl +
                          0x158),(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&challenge
                         );
  cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar3);
  cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_408[1] = &local_540.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value;
  local_540._0_8_ =
       "signet_params->GetConsensus().signet_challenge == std::vector<uint8_t>{OP_TRUE}";
  local_540.m_message.px = (element_type *)0xc8b8e2;
  local_418._8_8_ = local_418._8_8_ & 0xffffffffffffff00;
  local_418._0_8_ = &PTR__lazy_ostream_011481f0;
  local_408[0] = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_460 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&cb,(lazy_ostream *)local_418,1,0,WARN,_cVar11,(size_t)&local_468,
             0x4b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&challenge);
  CScript::CScript(&challenge,OP_1);
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4f;
  file_00.m_begin = (iterator)&local_478;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_488,
             msg_00);
  SignetTxs::Create((optional<SignetTxs> *)local_418,&block,&challenge);
  local_540._0_8_ = CONCAT71(local_540._1_7_,local_318) ^ 1;
  local_540.m_message.px = (element_type *)0x0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
  witness_commitment_section_141.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "!SignetTxs::Create(block, challenge)";
  witness_commitment_section_141.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "";
  cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)((ulong)cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_490 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  cb.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&witness_commitment_section_141;
  boost::test_tools::tt_detail::report_assertion
            (&local_540,(lazy_ostream *)&cb,1,0,WARN,_cVar11,(size_t)&local_498,0x4f);
  boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
  std::_Optional_payload_base<SignetTxs>::_M_reset((_Optional_payload_base<SignetTxs> *)local_418);
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = &DAT_00000050;
  file_01.m_begin = (iterator)&local_4a8;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4b8,
             msg_01);
  bVar3 = CheckSignetBlockSolution
                    (&block,(Params *)
                            signet_params._M_t.
                            super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                            .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl);
  cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,!bVar3);
  cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_540._0_8_ = "!CheckSignetBlockSolution(block, signet_params->GetConsensus())";
  local_540.m_message.px = (element_type *)0xc8b947;
  local_418._8_8_ = local_418._8_8_ & 0xffffffffffffff00;
  local_418._0_8_ = &PTR__lazy_ostream_011481f0;
  local_408[0] = boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_4c0 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_408[1] = &local_540.p_predicate_value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&cb,(lazy_ostream *)local_418,1,0,WARN,_cVar11,(size_t)&local_4c8,
             0x50);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &cb.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CMutableTransaction::CMutableTransaction(&cb);
  local_540._0_8_ = local_540._0_8_ & 0xffffffff00000000;
  local_408[0] = (undefined1 *)0x0;
  local_408[1] = (undefined1 *)0x0;
  local_418._0_8_ = (pointer)0x0;
  local_418._8_8_ = (pointer)0x0;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&cb.vout,(int *)&local_540,
             (CScript *)local_418);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_418);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_418);
  this_00 = &block.vtx;
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)this_00,(shared_ptr<const_CTransaction> *)local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_418 + 8));
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_418);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)this_00,(shared_ptr<const_CTransaction> *)local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_418 + 8));
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x57;
  file_02.m_begin = (iterator)&local_510;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_520,
             msg_02);
  SignetTxs::Create((optional<SignetTxs> *)local_418,&block,&challenge);
  witness_commitment_section_141.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(CONCAT71(witness_commitment_section_141.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._1_7_,local_318) ^ 1);
  witness_commitment_section_141.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  witness_commitment_section_141.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  witness_commitment_section_325.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "!SignetTxs::Create(block, challenge)";
  witness_commitment_section_325.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "";
  local_540.m_message.px = (element_type *)((ulong)local_540.m_message.px & 0xffffffffffffff00);
  local_540._0_8_ = &PTR__lazy_ostream_011481f0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_548 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_528 = (allocator_type *)&witness_commitment_section_325;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&witness_commitment_section_141,(lazy_ostream *)&local_540,1,0,WARN
             ,_cVar11,(size_t)&local_550,0x57);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &witness_commitment_section_141.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Optional_payload_base<SignetTxs>::_M_reset((_Optional_payload_base<SignetTxs> *)local_418);
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = &DAT_00000058;
  file_03.m_begin = (iterator)&local_560;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_570,
             msg_03);
  bVar3 = CheckSignetBlockSolution
                    (&block,(Params *)
                            signet_params._M_t.
                            super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                            .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl);
  local_540.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_540.m_message.px = (element_type *)0x0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
  witness_commitment_section_141.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       "!CheckSignetBlockSolution(block, signet_params->GetConsensus())";
  witness_commitment_section_141.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "";
  local_418._8_8_ = local_418._8_8_ & 0xffffffffffffff00;
  local_418._0_8_ = &PTR__lazy_ostream_011481f0;
  local_408[0] = boost::unit_test::lazy_ostream::inst;
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_578 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_408[1] = (undefined1 *)&witness_commitment_section_141;
  boost::test_tools::tt_detail::report_assertion
            (&local_540,(lazy_ostream *)local_418,1,0,WARN,_cVar11,(size_t)&local_580,0x58);
  boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
  local_418._0_4_ = 0xeda921aa;
  __l_00._M_len = 4;
  __l_00._M_array = local_418;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&witness_commitment_section_141,__l_00,(allocator_type *)&local_540);
  iVar10 = 0x20;
  while (bVar3 = iVar10 != 0, iVar10 = iVar10 + -1, bVar3) {
    local_418[0] = 0xff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&witness_commitment_section_141,local_418);
  }
  local_408[0] = (undefined1 *)0x0;
  local_408[1] = (undefined1 *)0x0;
  local_418._0_8_ = (pointer)0x0;
  local_418._8_8_ = (pointer)0x0;
  pCVar4 = CScript::operator<<((CScript *)local_418,OP_RETURN);
  ppVar5 = &CScript::operator<<(pCVar4,&witness_commitment_section_141)->super_CScriptBase;
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(&cb.vout,0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pvVar6->scriptPubKey).super_CScriptBase,ppVar5);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_418);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_418);
  p_Var7 = &std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::at(this_00,0)->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var7,(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_418 + 8));
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x61;
  file_04.m_begin = (iterator)&local_590;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_5a0,
             msg_04);
  SignetTxs::Create((optional<SignetTxs> *)local_418,&block,&challenge);
  witness_commitment_section_325.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(witness_commitment_section_325.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,local_318);
  witness_commitment_section_325.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  witness_commitment_section_325.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528 = (allocator_type *)&local_630;
  local_630._0_8_ = "SignetTxs::Create(block, challenge)";
  local_630.m_message.px = (element_type *)0xc8b907;
  local_540.m_message.px = (element_type *)((ulong)local_540.m_message.px & 0xffffffffffffff00);
  local_540._0_8_ = &PTR__lazy_ostream_011481f0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_5c0 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&witness_commitment_section_325,(lazy_ostream *)&local_540,1,0,WARN
             ,_cVar11,(size_t)&local_5c8,0x61);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &witness_commitment_section_325.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Optional_payload_base<SignetTxs>::_M_reset((_Optional_payload_base<SignetTxs> *)local_418);
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x62;
  file_05.m_begin = (iterator)&local_5d8;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_5e8,
             msg_05);
  bVar3 = CheckSignetBlockSolution
                    (&block,(Params *)
                            signet_params._M_t.
                            super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                            .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl);
  local_540.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar3;
  local_540.m_message.px = (element_type *)0x0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
  witness_commitment_section_325.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       "CheckSignetBlockSolution(block, signet_params->GetConsensus())";
  witness_commitment_section_325.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "";
  local_418._8_8_ = local_418._8_8_ & 0xffffffffffffff00;
  local_418._0_8_ = &PTR__lazy_ostream_011481f0;
  local_408[0] = boost::unit_test::lazy_ostream::inst;
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_5f0 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_408[1] = (undefined1 *)&witness_commitment_section_325;
  boost::test_tools::tt_detail::report_assertion
            (&local_540,(lazy_ostream *)local_418,1,0,WARN,_cVar11,(size_t)&local_5f8,0x62);
  boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
  local_418._0_4_ = 0xa2dac7ec;
  __l_01._M_len = 4;
  __l_01._M_array = local_418;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&witness_commitment_section_325,__l_01,(allocator_type *)&local_540);
  local_408[0] = (undefined1 *)0x0;
  local_408[1] = (undefined1 *)0x0;
  local_418._0_8_ = (pointer)0x0;
  local_418._8_8_ = (pointer)0x0;
  pCVar4 = CScript::operator<<((CScript *)local_418,OP_RETURN);
  pCVar4 = CScript::operator<<(pCVar4,&witness_commitment_section_141);
  ppVar5 = &CScript::operator<<(pCVar4,&witness_commitment_section_325)->super_CScriptBase;
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(&cb.vout,0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pvVar6->scriptPubKey).super_CScriptBase,ppVar5);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_418);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_418);
  p_Var7 = &std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::at(this_00,0)->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var7,(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_418 + 8));
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = &DAT_00000068;
  file_06.m_begin = (iterator)&local_608;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_618,
             msg_06);
  SignetTxs::Create((optional<SignetTxs> *)local_418,&block,&challenge);
  local_630.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)local_318;
  local_630.m_message.px = (element_type *)0x0;
  local_630.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_640 = "SignetTxs::Create(block, challenge)";
  local_638 = "";
  local_540.m_message.px = (element_type *)((ulong)local_540.m_message.px & 0xffffffffffffff00);
  local_540._0_8_ = &PTR__lazy_ostream_011481f0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_648 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_528 = (allocator_type *)&local_640;
  boost::test_tools::tt_detail::report_assertion
            (&local_630,(lazy_ostream *)&local_540,1,0,WARN,_cVar11,(size_t)&local_650,0x68);
  boost::detail::shared_count::~shared_count(&local_630.m_message.pn);
  std::_Optional_payload_base<SignetTxs>::_M_reset((_Optional_payload_base<SignetTxs> *)local_418);
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x69;
  file_07.m_begin = (iterator)&local_660;
  msg_07.m_end = pvVar9;
  msg_07.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_670,
             msg_07);
  bVar3 = CheckSignetBlockSolution
                    (&block,(Params *)
                            signet_params._M_t.
                            super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                            .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl);
  local_540.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar3;
  local_540.m_message.px = (element_type *)0x0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_630._0_8_ = "CheckSignetBlockSolution(block, signet_params->GetConsensus())";
  local_630.m_message.px = (element_type *)0xc8b947;
  local_418._8_8_ = local_418._8_8_ & 0xffffffffffffff00;
  local_418._0_8_ = &PTR__lazy_ostream_011481f0;
  local_408[0] = boost::unit_test::lazy_ostream::inst;
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_678 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_408[1] = &local_630.p_predicate_value;
  boost::test_tools::tt_detail::report_assertion
            (&local_540,(lazy_ostream *)local_418,1,0,WARN,_cVar11,(size_t)&local_680,0x69);
  boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
  local_418[0] = (string)0x1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&witness_commitment_section_325,local_418);
  local_418[0] = 0x51;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&witness_commitment_section_325,local_418);
  local_408[0] = (undefined1 *)0x0;
  local_408[1] = (undefined1 *)0x0;
  local_418._0_8_ = (pointer)0x0;
  local_418._8_8_ = (pointer)0x0;
  pCVar4 = CScript::operator<<((CScript *)local_418,OP_RETURN);
  pCVar4 = CScript::operator<<(pCVar4,&witness_commitment_section_141);
  ppVar5 = &CScript::operator<<(pCVar4,&witness_commitment_section_325)->super_CScriptBase;
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(&cb.vout,0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pvVar6->scriptPubKey).super_CScriptBase,ppVar5);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_418);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_418);
  p_Var7 = &std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::at(this_00,0)->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var7,(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_418 + 8));
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_688 = "";
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x70;
  file_08.m_begin = (iterator)&local_690;
  msg_08.m_end = pvVar9;
  msg_08.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_6a0,
             msg_08);
  SignetTxs::Create((optional<SignetTxs> *)local_418,&block,&challenge);
  local_630._0_8_ = CONCAT71(local_630._1_7_,local_318) ^ 1;
  local_630.m_message.px = (element_type *)0x0;
  local_630.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_640 = "!SignetTxs::Create(block, challenge)";
  local_638 = "";
  local_540.m_message.px = (element_type *)((ulong)local_540.m_message.px & 0xffffffffffffff00);
  local_540._0_8_ = &PTR__lazy_ostream_011481f0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_6a8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_528 = (allocator_type *)&local_640;
  boost::test_tools::tt_detail::report_assertion
            (&local_630,(lazy_ostream *)&local_540,1,0,WARN,_cVar11,(size_t)&local_6b0,0x70);
  boost::detail::shared_count::~shared_count(&local_630.m_message.pn);
  std::_Optional_payload_base<SignetTxs>::_M_reset((_Optional_payload_base<SignetTxs> *)local_418);
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x71;
  file_09.m_begin = (iterator)&local_6c0;
  msg_09.m_end = pvVar9;
  msg_09.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_6d0,
             msg_09);
  bVar3 = CheckSignetBlockSolution
                    (&block,(Params *)
                            signet_params._M_t.
                            super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                            .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl);
  local_540.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_540.m_message.px = (element_type *)0x0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_630._0_8_ = "!CheckSignetBlockSolution(block, signet_params->GetConsensus())";
  local_630.m_message.px = (element_type *)0xc8b947;
  local_418._8_8_ = local_418._8_8_ & 0xffffffffffffff00;
  local_418._0_8_ = &PTR__lazy_ostream_011481f0;
  local_408[0] = boost::unit_test::lazy_ostream::inst;
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_6d8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_408[1] = &local_630.p_predicate_value;
  boost::test_tools::tt_detail::report_assertion
            (&local_540,(lazy_ostream *)local_418,1,0,WARN,_cVar11,(size_t)&local_6e0,0x71);
  boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
  local_418._0_8_ = local_418._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&witness_commitment_section_325,local_418);
  local_408[0] = (undefined1 *)0x0;
  local_408[1] = (undefined1 *)0x0;
  local_418._0_8_ = (pointer)0x0;
  local_418._8_8_ = (pointer)0x0;
  pCVar4 = CScript::operator<<((CScript *)local_418,OP_RETURN);
  pCVar4 = CScript::operator<<(pCVar4,&witness_commitment_section_141);
  ppVar5 = &CScript::operator<<(pCVar4,&witness_commitment_section_325)->super_CScriptBase;
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(&cb.vout,0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pvVar6->scriptPubKey).super_CScriptBase,ppVar5);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_418);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_418);
  p_Var7 = &std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::at(this_00,0)->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var7,(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_418 + 8));
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x77;
  file_10.m_begin = (iterator)&local_6f0;
  msg_10.m_end = pvVar9;
  msg_10.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_700,
             msg_10);
  SignetTxs::Create((optional<SignetTxs> *)local_418,&block,&challenge);
  local_630.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)local_318;
  local_630.m_message.px = (element_type *)0x0;
  local_630.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_640 = "SignetTxs::Create(block, challenge)";
  local_638 = "";
  local_540.m_message.px = (element_type *)((ulong)local_540.m_message.px & 0xffffffffffffff00);
  local_540._0_8_ = &PTR__lazy_ostream_011481f0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_710 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_708 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_528 = (allocator_type *)&local_640;
  boost::test_tools::tt_detail::report_assertion
            (&local_630,(lazy_ostream *)&local_540,1,0,WARN,_cVar11,(size_t)&local_710,0x77);
  boost::detail::shared_count::~shared_count(&local_630.m_message.pn);
  std::_Optional_payload_base<SignetTxs>::_M_reset((_Optional_payload_base<SignetTxs> *)local_418);
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x78;
  file_11.m_begin = (iterator)&local_720;
  msg_11.m_end = pvVar9;
  msg_11.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_730,
             msg_11);
  bVar3 = CheckSignetBlockSolution
                    (&block,(Params *)
                            signet_params._M_t.
                            super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                            .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl);
  local_540.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar3;
  local_540.m_message.px = (element_type *)0x0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_630._0_8_ = "CheckSignetBlockSolution(block, signet_params->GetConsensus())";
  local_630.m_message.px = (element_type *)0xc8b947;
  local_418._8_8_ = local_418._8_8_ & 0xffffffffffffff00;
  local_418._0_8_ = &PTR__lazy_ostream_011481f0;
  local_408[0] = boost::unit_test::lazy_ostream::inst;
  local_740 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_738 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_408[1] = &local_630.p_predicate_value;
  boost::test_tools::tt_detail::report_assertion
            (&local_540,(lazy_ostream *)local_418,1,0,WARN,_cVar11,(size_t)&local_740,0x78);
  boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
  local_418._0_8_ = local_418._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&witness_commitment_section_325,local_418);
  local_408[0] = (undefined1 *)0x0;
  local_408[1] = (undefined1 *)0x0;
  local_418._0_8_ = (pointer)0x0;
  local_418._8_8_ = (pointer)0x0;
  pCVar4 = CScript::operator<<((CScript *)local_418,OP_RETURN);
  pCVar4 = CScript::operator<<(pCVar4,&witness_commitment_section_141);
  ppVar5 = &CScript::operator<<(pCVar4,&witness_commitment_section_325)->super_CScriptBase;
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(&cb.vout,0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pvVar6->scriptPubKey).super_CScriptBase,ppVar5);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_418);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_418);
  p_Var7 = &std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::at(this_00,0)->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var7,(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_418 + 8));
  local_750 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x7e;
  file_12.m_begin = (iterator)&local_750;
  msg_12.m_end = pvVar9;
  msg_12.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_760,
             msg_12);
  SignetTxs::Create((optional<SignetTxs> *)local_418,&block,&challenge);
  local_630._0_8_ = CONCAT71(local_630._1_7_,local_318) ^ 1;
  local_630.m_message.px = (element_type *)0x0;
  local_630.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_640 = "!SignetTxs::Create(block, challenge)";
  local_638 = "";
  local_540.m_message.px = (element_type *)((ulong)local_540.m_message.px & 0xffffffffffffff00);
  local_540._0_8_ = &PTR__lazy_ostream_011481f0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_770 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_768 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_528 = (allocator_type *)&local_640;
  boost::test_tools::tt_detail::report_assertion
            (&local_630,(lazy_ostream *)&local_540,1,0,WARN,_cVar11,(size_t)&local_770,0x7e);
  boost::detail::shared_count::~shared_count(&local_630.m_message.pn);
  std::_Optional_payload_base<SignetTxs>::_M_reset((_Optional_payload_base<SignetTxs> *)local_418);
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x7f;
  file_13.m_begin = (iterator)&local_780;
  msg_13.m_end = pvVar9;
  msg_13.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_790,
             msg_13);
  bVar3 = CheckSignetBlockSolution
                    (&block,(Params *)
                            signet_params._M_t.
                            super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                            .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl);
  local_540.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_540.m_message.px = (element_type *)0x0;
  local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_630._0_8_ = "!CheckSignetBlockSolution(block, signet_params->GetConsensus())";
  local_630.m_message.px = (element_type *)0xc8b947;
  local_418._8_8_ = local_418._8_8_ & 0xffffffffffffff00;
  local_418._0_8_ = &PTR__lazy_ostream_011481f0;
  local_408[0] = boost::unit_test::lazy_ostream::inst;
  local_408[1] = &local_630.p_predicate_value;
  boost::test_tools::tt_detail::report_assertion
            (&local_540,(lazy_ostream *)local_418,1,0,WARN,0xc8b7a0,(size_t)&stack0xfffffffffffff860
             ,0x7f);
  boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&witness_commitment_section_325.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&witness_commitment_section_141.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  CMutableTransaction::~CMutableTransaction(&cb);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&challenge.super_CScriptBase);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(this_00);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&signet_params);
  ArgsManager::~ArgsManager(&signet_argsman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(signet_parse_tests)
{
    ArgsManager signet_argsman;
    signet_argsman.ForceSetArg("-signetchallenge", "51"); // set challenge to OP_TRUE
    const auto signet_params = CreateChainParams(signet_argsman, ChainType::SIGNET);
    CBlock block;
    BOOST_CHECK(signet_params->GetConsensus().signet_challenge == std::vector<uint8_t>{OP_TRUE});
    CScript challenge{OP_TRUE};

    // empty block is invalid
    BOOST_CHECK(!SignetTxs::Create(block, challenge));
    BOOST_CHECK(!CheckSignetBlockSolution(block, signet_params->GetConsensus()));

    // no witness commitment
    CMutableTransaction cb;
    cb.vout.emplace_back(0, CScript{});
    block.vtx.push_back(MakeTransactionRef(cb));
    block.vtx.push_back(MakeTransactionRef(cb)); // Add dummy tx to exercise merkle root code
    BOOST_CHECK(!SignetTxs::Create(block, challenge));
    BOOST_CHECK(!CheckSignetBlockSolution(block, signet_params->GetConsensus()));

    // no header is treated valid
    std::vector<uint8_t> witness_commitment_section_141{0xaa, 0x21, 0xa9, 0xed};
    for (int i = 0; i < 32; ++i) {
        witness_commitment_section_141.push_back(0xff);
    }
    cb.vout.at(0).scriptPubKey = CScript{} << OP_RETURN << witness_commitment_section_141;
    block.vtx.at(0) = MakeTransactionRef(cb);
    BOOST_CHECK(SignetTxs::Create(block, challenge));
    BOOST_CHECK(CheckSignetBlockSolution(block, signet_params->GetConsensus()));

    // no data after header, valid
    std::vector<uint8_t> witness_commitment_section_325{0xec, 0xc7, 0xda, 0xa2};
    cb.vout.at(0).scriptPubKey = CScript{} << OP_RETURN << witness_commitment_section_141 << witness_commitment_section_325;
    block.vtx.at(0) = MakeTransactionRef(cb);
    BOOST_CHECK(SignetTxs::Create(block, challenge));
    BOOST_CHECK(CheckSignetBlockSolution(block, signet_params->GetConsensus()));

    // Premature end of data, invalid
    witness_commitment_section_325.push_back(0x01);
    witness_commitment_section_325.push_back(0x51);
    cb.vout.at(0).scriptPubKey = CScript{} << OP_RETURN << witness_commitment_section_141 << witness_commitment_section_325;
    block.vtx.at(0) = MakeTransactionRef(cb);
    BOOST_CHECK(!SignetTxs::Create(block, challenge));
    BOOST_CHECK(!CheckSignetBlockSolution(block, signet_params->GetConsensus()));

    // has data, valid
    witness_commitment_section_325.push_back(0x00);
    cb.vout.at(0).scriptPubKey = CScript{} << OP_RETURN << witness_commitment_section_141 << witness_commitment_section_325;
    block.vtx.at(0) = MakeTransactionRef(cb);
    BOOST_CHECK(SignetTxs::Create(block, challenge));
    BOOST_CHECK(CheckSignetBlockSolution(block, signet_params->GetConsensus()));

    // Extraneous data, invalid
    witness_commitment_section_325.push_back(0x00);
    cb.vout.at(0).scriptPubKey = CScript{} << OP_RETURN << witness_commitment_section_141 << witness_commitment_section_325;
    block.vtx.at(0) = MakeTransactionRef(cb);
    BOOST_CHECK(!SignetTxs::Create(block, challenge));
    BOOST_CHECK(!CheckSignetBlockSolution(block, signet_params->GetConsensus()));
}